

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool cmsys::SystemTools::ConvertDateMacroString(char *str,time_t *tmt)

{
  size_t sVar1;
  char *pcVar2;
  time_t tVar3;
  int year;
  int day;
  int month;
  char *ptr;
  char acStack_60 [3];
  char cStack_5d;
  char buffer [12];
  tm tmt2;
  time_t *tmt_local;
  char *str_local;
  
  if (((str != (char *)0x0) && (tmt != (time_t *)0x0)) && (sVar1 = strlen(str), sVar1 < 0xc)) {
    strcpy((char *)((long)&ptr + 4),str);
    ptr._7_1_ = 0;
    pcVar2 = strstr(ConvertDateMacroString::month_names,(char *)((long)&ptr + 4));
    if (pcVar2 == (char *)0x0) {
      return false;
    }
    atoi(acStack_60);
    atoi(&cStack_5d);
    buffer[8] = '\0';
    buffer[9] = '\0';
    buffer[10] = '\0';
    buffer[0xb] = '\0';
    buffer[4] = '\0';
    buffer[5] = '\0';
    buffer[6] = '\0';
    buffer[7] = '\0';
    tVar3 = mktime((tm *)(buffer + 4));
    *tmt = tVar3;
    return true;
  }
  return false;
}

Assistant:

bool SystemTools::ConvertDateMacroString(const char *str, time_t *tmt)
{
  if (!str || !tmt || strlen(str) > 11)
    {
    return false;
    }

  struct tm tmt2;

  // __DATE__
  // The compilation date of the current source file. The date is a string
  // literal of the form Mmm dd yyyy. The month name Mmm is the same as for
  // dates generated by the library function asctime declared in TIME.H.

  // index:   012345678901
  // format:  Mmm dd yyyy
  // example: Dec 19 2003

  static char month_names[] = "JanFebMarAprMayJunJulAugSepOctNovDec";

  char buffer[12];
  strcpy(buffer, str);

  buffer[3] = 0;
  char *ptr = strstr(month_names, buffer);
  if (!ptr)
    {
    return false;
    }

  int month = static_cast<int>((ptr - month_names) / 3);
  int day = atoi(buffer + 4);
  int year = atoi(buffer + 7);

  tmt2.tm_isdst = -1;
  tmt2.tm_hour  = 0;
  tmt2.tm_min   = 0;
  tmt2.tm_sec   = 0;
  tmt2.tm_wday  = 0;
  tmt2.tm_yday  = 0;
  tmt2.tm_mday  = day;
  tmt2.tm_mon   = month;
  tmt2.tm_year  = year - 1900;

  *tmt = mktime(&tmt2);
  return true;
}